

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_layout_qualifiers
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  ProgramInfo *pPVar6;
  ShaderInfo *pSVar7;
  MessageBuilder *this;
  byte local_11a1;
  char *local_1018;
  allocator<char> local_1009;
  string local_1008;
  MessageBuilder local_fe8;
  char *local_e68;
  char *message;
  TestLog *log;
  undefined1 local_e50 [6];
  bool testFailed;
  ProgramSources local_e30;
  undefined1 local_d60 [8];
  ShaderProgram program_3;
  undefined1 local_c70 [8];
  ComputeSource compSource_3;
  ostringstream compShaderSource_3;
  string local_ac8;
  ProgramSources local_aa8;
  undefined1 local_9d8 [8];
  ShaderProgram program_2;
  undefined1 local_8e8 [8];
  ComputeSource compSource_2;
  ostringstream compShaderSource_2;
  string local_740;
  ProgramSources local_720;
  undefined1 local_650 [8];
  ShaderProgram program_1;
  undefined1 local_560 [8];
  ComputeSource compSource_1;
  ostringstream compShaderSource_1;
  string local_3b8;
  ProgramSources local_398;
  undefined1 local_2c8 [8];
  ShaderProgram program;
  undefined1 local_1d8 [8];
  ComputeSource compSource;
  ostringstream local_1a0 [8];
  ostringstream compShaderSource;
  char *shaderVersion;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar2) {
    local_1018 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_1018 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  compShaderSource._368_8_ = local_1018;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::operator<<((ostream *)local_1a0,(char *)compShaderSource._368_8_);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)local_1d8,(string *)&program.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_398);
  pPVar5 = glu::ProgramSources::operator<<(&local_398,(ShaderSource *)local_1d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2c8,pRVar3,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,
             "A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size."
             ,(allocator<char> *)&compShaderSource_1.field_0x177);
  NegativeTestContext::beginSection(ctx,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&compShaderSource_1.field_0x177);
  verifyLinkError(ctx,(ShaderProgram *)local_2c8);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2c8);
  glu::ComputeSource::~ComputeSource((ComputeSource *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  poVar1 = (ostringstream *)(compSource_1.super_ShaderSource.source.field_2._M_local_buf + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  poVar4 = std::operator<<((ostream *)poVar1,(char *)compShaderSource._368_8_);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)local_560,(string *)&program_1.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)&program_1.m_program.m_info.linkTimeUs);
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_720);
  pPVar5 = glu::ProgramSources::operator<<(&local_720,(ShaderSource *)local_560);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_650,pRVar3,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,
             "A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader."
             ,(allocator<char> *)&compShaderSource_2.field_0x177);
  NegativeTestContext::beginSection(ctx,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator((allocator<char> *)&compShaderSource_2.field_0x177);
  verifyCompileError(ctx,(ShaderProgram *)local_650,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_650);
  glu::ComputeSource::~ComputeSource((ComputeSource *)local_560);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(compSource_1.super_ShaderSource.source.field_2._M_local_buf + 8));
  poVar1 = (ostringstream *)(compSource_2.super_ShaderSource.source.field_2._M_local_buf + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  poVar4 = std::operator<<((ostream *)poVar1,(char *)compShaderSource._368_8_);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"out mediump vec4 fragColor;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)local_8e8,(string *)&program_2.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)&program_2.m_program.m_info.linkTimeUs);
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_aa8);
  pPVar5 = glu::ProgramSources::operator<<(&local_aa8,(ShaderSource *)local_8e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_9d8,pRVar3,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_aa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ac8,
             "A compile-time error is generated if a user defined output variable is declared in a compute shader."
             ,(allocator<char> *)&compShaderSource_3.field_0x177);
  NegativeTestContext::beginSection(ctx,&local_ac8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&compShaderSource_3.field_0x177);
  verifyCompileError(ctx,(ShaderProgram *)local_9d8,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_9d8);
  glu::ComputeSource::~ComputeSource((ComputeSource *)local_8e8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(compSource_2.super_ShaderSource.source.field_2._M_local_buf + 8));
  poVar1 = (ostringstream *)(compSource_3.super_ShaderSource.source.field_2._M_local_buf + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  poVar4 = std::operator<<((ostream *)poVar1,(char *)compShaderSource._368_8_);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_NumWorkGroups;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_WorkGroupSize;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_WorkGroupID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_LocalInvocationID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_GlobalInvocationID;\n");
  poVar4 = std::operator<<(poVar4,"uvec3 gl_LocalInvocationIndex;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)local_c70,(string *)&program_3.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)&program_3.m_program.m_info.linkTimeUs);
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_e30);
  pPVar5 = glu::ProgramSources::operator<<(&local_e30,(ShaderSource *)local_c70);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_d60,pRVar3,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_e30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e50,
             "A compile time or link error is generated if compute shader built-in variables are redeclared."
             ,(allocator<char> *)((long)&log + 7));
  NegativeTestContext::beginSection(ctx,(string *)local_e50);
  std::__cxx11::string::~string((string *)local_e50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  log._6_1_ = 0;
  message = (char *)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<((TestLog *)message,(ShaderProgram *)local_d60);
  pPVar6 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_d60);
  local_11a1 = 0;
  if ((pPVar6->linkOk & 1U) != 0) {
    pSVar7 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_d60,SHADERTYPE_COMPUTE,0);
    local_11a1 = pSVar7->compileOk;
  }
  log._6_1_ = local_11a1 & 1;
  if (log._6_1_ != 0) {
    local_e68 = "Program was not expected to compile or link.";
    tcu::TestLog::operator<<
              (&local_fe8,(TestLog *)message,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<(&local_fe8,&local_e68);
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_fe8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1008,"Program was not expected to compile or link.",&local_1009);
    NegativeTestContext::fail(ctx,&local_1008);
    std::__cxx11::string::~string((string *)&local_1008);
    std::allocator<char>::~allocator(&local_1009);
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_d60);
  glu::ComputeSource::~ComputeSource((ComputeSource *)local_c70);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(compSource_3.super_ShaderSource.source.field_2._M_local_buf + 8));
  return;
}

Assistant:

void invalid_layout_qualifiers (NegativeTestContext& ctx)
{
	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size.");
		verifyLinkError(ctx, program);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"out mediump vec4 fragColor;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a user defined output variable is declared in a compute shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"uvec3 gl_NumWorkGroups;\n"
							<<	"uvec3 gl_WorkGroupSize;\n"
							<<	"uvec3 gl_WorkGroupID;\n"
							<<	"uvec3 gl_LocalInvocationID;\n"
							<<	"uvec3 gl_GlobalInvocationID;\n"
							<<	"uvec3 gl_LocalInvocationIndex;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile time or link error is generated if compute shader built-in variables are redeclared.");
		bool testFailed = false;

		tcu::TestLog& log = ctx.getLog();
		log << program;

		testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

		if (testFailed)
		{
			const char* const message("Program was not expected to compile or link.");
			log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
			ctx.fail(message);
		}

		ctx.endSection();
	}
}